

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test::TestBody
          (MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this)

{
  FieldDescriptor *field;
  Message *in_RCX;
  pointer *__ptr;
  char *in_R9;
  string_view input;
  string_view input_00;
  _Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false> local_378;
  AssertHelper local_370;
  Message local_368;
  string local_360;
  AssertionResult gtest_ar_;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differ;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  input._M_str = (char *)&msg1;
  input._M_len = (size_t)"rm { a: 11\n b: 12 }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000013,input,in_RCX);
  input_00._M_str = (char *)&msg2;
  input_00._M_len = (size_t)"rm { a: 11\n b: 13 }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000013,input_00,in_RCX);
  util::MessageDifferencer::MessageDifferencer(&differ);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"rm",(allocator<char> *)&gtest_ar_);
  field = GetFieldDescriptor(&msg1.super_Message,&local_360);
  util::MessageDifferencer::TreatAsSet(&differ,field);
  std::__cxx11::string::~string((string *)&local_360);
  std::make_unique<google::protobuf::(anonymous_namespace)::TestIgnorer>();
  local_378._M_head_impl = (IgnoreCriteria *)local_360._M_dataplus._M_p;
  util::MessageDifferencer::AddIgnoreCriteria
            (&differ,(unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                      *)&local_378);
  if (local_378._M_head_impl != (IgnoreCriteria *)0x0) {
    (*(local_378._M_head_impl)->_vptr_IgnoreCriteria[1])();
  }
  local_378._M_head_impl = (IgnoreCriteria *)0x0;
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&differ,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,(internal *)&gtest_ar_,(AssertionResult *)"differ.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x960,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&local_360);
    if (local_368.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_368.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differ);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsSetWithIgnoredFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n b: 12 }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n b: 13 }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsSet(GetFieldDescriptor(msg1, "rm"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}